

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

void __thiscall RSA::print_last_plaintext_line(RSA *this)

{
  bool bVar1;
  ostream *poVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  char local_69;
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50 [3];
  allocator local_31;
  string local_30 [32];
  RSA *local_10;
  RSA *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Plain Text",&local_31);
  Crypto::print_header(&this->super_Crypto,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_60._M_current = (char *)std::__cxx11::string::begin();
  local_68 = (char *)std::__cxx11::string::end();
  local_69 = '_';
  local_58 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_68,&local_69);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_50,&local_58);
  local_80._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
  std::__cxx11::string::erase(&(this->super_Crypto).plainText,local_50[0],local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,"Text: ");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_Crypto).plainText);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = BigInt::isZero(&this->plain_BigInt);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Num: ");
    poVar2 = operator<<(poVar2,&this->plain_BigInt);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RSA::print_last_plaintext_line() {
    print_header("Plain Text");
    plainText.erase(std::remove(plainText.begin(), plainText.end(), '_'), plainText.end()); //! remove any special character
    cout << "Text: " << plainText << endl;

    if (!plain_BigInt.isZero())
        cout << "Num: " << plain_BigInt << endl;
}